

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void calc_target_weighted_pred_left
               (MACROBLOCKD *xd,int rel_mi_row,int rel_mi_col,uint8_t op_mi_size,int dir,
               MB_MODE_INFO *nb_mi,void *fun_ctxt,int num_planes)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  byte in_CL;
  int in_ESI;
  MACROBLOCKD *in_RDI;
  uint8_t m1_1;
  uint8_t m0_1;
  int col_1;
  int row_1;
  uint16_t *tmp16;
  uint8_t m1;
  uint8_t m0;
  int col;
  int row;
  int is_hbd;
  uint8_t *tmp;
  int32_t *mask;
  int32_t *wsrc;
  uint8_t *mask1d;
  int bw;
  calc_target_weighted_pred_ctxt *ctxt;
  int local_70;
  int local_6c;
  long local_68;
  int local_5c;
  int local_58;
  long local_50;
  long local_48;
  long local_40;
  
  iVar2 = (uint)in_RDI->width * 4;
  puVar4 = av1_get_obmc_mask(*(int *)((long)_col_1 + 0x14));
  local_40 = *(long *)*_col_1 + (long)(in_ESI * 4 * iVar2) * 4;
  local_48 = *(long *)(*_col_1 + 8) + (long)(in_ESI * 4 * iVar2) * 4;
  local_50 = _col_1[1] + (long)(in_ESI * 4 * (int)_col_1[2]);
  iVar3 = is_cur_buf_hbd(in_RDI);
  if (iVar3 == 0) {
    for (local_58 = 0; local_58 < (int)((uint)in_CL * 4); local_58 = local_58 + 1) {
      for (local_5c = 0; local_5c < *(int *)((long)_col_1 + 0x14); local_5c = local_5c + 1) {
        bVar1 = puVar4[local_5c];
        *(uint *)(local_40 + (long)local_5c * 4) =
             (*(int *)(local_40 + (long)local_5c * 4) >> 6) * (uint)bVar1 +
             (uint)*(byte *)(local_50 + local_5c) * 0x40 * (uint)(byte)(0x40 - bVar1);
        *(uint *)(local_48 + (long)local_5c * 4) =
             (*(int *)(local_48 + (long)local_5c * 4) >> 6) * (uint)bVar1;
      }
      local_40 = local_40 + (long)iVar2 * 4;
      local_48 = local_48 + (long)iVar2 * 4;
      local_50 = local_50 + (int)_col_1[2];
    }
  }
  else {
    local_68 = local_50 * 2;
    for (local_6c = 0; local_6c < (int)((uint)in_CL * 4); local_6c = local_6c + 1) {
      for (local_70 = 0; local_70 < *(int *)((long)_col_1 + 0x14); local_70 = local_70 + 1) {
        bVar1 = puVar4[local_70];
        *(uint *)(local_40 + (long)local_70 * 4) =
             (*(int *)(local_40 + (long)local_70 * 4) >> 6) * (uint)bVar1 +
             (uint)*(ushort *)(local_68 + (long)local_70 * 2) * 0x40 * (uint)(byte)(0x40 - bVar1);
        *(uint *)(local_48 + (long)local_70 * 4) =
             (*(int *)(local_48 + (long)local_70 * 4) >> 6) * (uint)bVar1;
      }
      local_40 = local_40 + (long)iVar2 * 4;
      local_48 = local_48 + (long)iVar2 * 4;
      local_68 = local_68 + (long)(int)_col_1[2] * 2;
    }
  }
  return;
}

Assistant:

static inline void calc_target_weighted_pred_left(
    MACROBLOCKD *xd, int rel_mi_row, int rel_mi_col, uint8_t op_mi_size,
    int dir, MB_MODE_INFO *nb_mi, void *fun_ctxt, const int num_planes) {
  (void)nb_mi;
  (void)num_planes;
  (void)rel_mi_col;
  (void)dir;

  struct calc_target_weighted_pred_ctxt *ctxt =
      (struct calc_target_weighted_pred_ctxt *)fun_ctxt;

  const int bw = xd->width << MI_SIZE_LOG2;
  const uint8_t *const mask1d = av1_get_obmc_mask(ctxt->overlap);

  int32_t *wsrc = ctxt->obmc_buffer->wsrc + (rel_mi_row * MI_SIZE * bw);
  int32_t *mask = ctxt->obmc_buffer->mask + (rel_mi_row * MI_SIZE * bw);
  const uint8_t *tmp = ctxt->tmp + (rel_mi_row * MI_SIZE * ctxt->tmp_stride);
  const int is_hbd = is_cur_buf_hbd(xd);

  if (!is_hbd) {
    for (int row = 0; row < op_mi_size * MI_SIZE; ++row) {
      for (int col = 0; col < ctxt->overlap; ++col) {
        const uint8_t m0 = mask1d[col];
        const uint8_t m1 = AOM_BLEND_A64_MAX_ALPHA - m0;
        wsrc[col] = (wsrc[col] >> AOM_BLEND_A64_ROUND_BITS) * m0 +
                    (tmp[col] << AOM_BLEND_A64_ROUND_BITS) * m1;
        mask[col] = (mask[col] >> AOM_BLEND_A64_ROUND_BITS) * m0;
      }
      wsrc += bw;
      mask += bw;
      tmp += ctxt->tmp_stride;
    }
  } else {
    const uint16_t *tmp16 = CONVERT_TO_SHORTPTR(tmp);

    for (int row = 0; row < op_mi_size * MI_SIZE; ++row) {
      for (int col = 0; col < ctxt->overlap; ++col) {
        const uint8_t m0 = mask1d[col];
        const uint8_t m1 = AOM_BLEND_A64_MAX_ALPHA - m0;
        wsrc[col] = (wsrc[col] >> AOM_BLEND_A64_ROUND_BITS) * m0 +
                    (tmp16[col] << AOM_BLEND_A64_ROUND_BITS) * m1;
        mask[col] = (mask[col] >> AOM_BLEND_A64_ROUND_BITS) * m0;
      }
      wsrc += bw;
      mask += bw;
      tmp16 += ctxt->tmp_stride;
    }
  }
}